

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

void __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Serialize(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
            *this,uchar *ptr)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *val;
  uint *puVar7;
  byte bVar8;
  uint uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar6 = 0;
  if (puVar7 == puVar2) {
    bVar10 = true;
    bVar8 = 0;
  }
  else {
    bVar8 = 0;
    do {
      uVar9 = *puVar7;
      iVar4 = 0x20;
      if (-0x19 < iVar6) {
        bVar3 = (byte)iVar6 & 0x1f;
        *ptr = bVar8 | (byte)(uVar9 << bVar3);
        ptr = ptr + 1;
        uVar9 = uVar9 >> (8 - (byte)iVar6 & 0x1f);
        iVar4 = iVar6 + 0x18;
        iVar6 = 0 << bVar3;
        bVar8 = 0;
      }
      iVar5 = iVar4;
      if (7 < iVar4) {
        do {
          *ptr = (byte)uVar9;
          ptr = ptr + 1;
          uVar9 = uVar9 >> 8;
          iVar4 = iVar5 + -8;
          bVar10 = 0xf < iVar5;
          iVar5 = iVar4;
        } while (bVar10);
      }
      bVar8 = bVar8 | (byte)((~(-1 << ((byte)iVar4 & 0x1f)) & uVar9) << ((byte)iVar6 & 0x1f));
      iVar6 = iVar4 + iVar6;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    bVar10 = iVar6 == 0;
  }
  if (!bVar10) {
    *ptr = bVar8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Serialize(unsigned char* ptr) const override
    {
        BitWriter writer(ptr);
        for (const auto& val : m_syndromes) {
            m_field.Serialize(writer, val);
        }
        writer.Flush();
    }